

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void xla::MoveToList(Rep *r,vector<int,_std::allocator<int>_> *src,
                    vector<int,_std::allocator<int>_> *dst)

{
  int32_t iVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int local_2c;
  ulong uStack_28;
  int32_t w;
  size_t i;
  vector<int,_std::allocator<int>_> *dst_local;
  vector<int,_std::allocator<int>_> *src_local;
  Rep *r_local;
  
  uStack_28 = 0;
  i = (size_t)dst;
  dst_local = src;
  src_local = (vector<int,_std::allocator<int>_> *)r;
  while( true ) {
    uVar2 = uStack_28;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(dst_local);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](dst_local,uStack_28);
    local_2c = *pvVar4;
    pvVar5 = std::
             vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ::operator[]((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                           *)src_local,(long)local_2c);
    iVar1 = pvVar5->rank;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](dst_local,uStack_28);
    *pvVar4 = iVar1;
    pvVar5 = std::
             vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ::operator[]((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                           *)src_local,(long)local_2c);
    pvVar5->visited = false;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)i,&local_2c);
    uStack_28 = uStack_28 + 1;
  }
  return;
}

Assistant:

static void MoveToList(GraphCycles::Rep* r, std::vector<int32_t>* src,
                       std::vector<int32_t>* dst) {
  for (size_t i = 0; i < src->size(); i++) {
    int32_t w = (*src)[i];
    (*src)[i] = r->nodes_[w].rank;  // Replace src entry with its rank
    r->nodes_[w].visited = false;   // Prepare for future DFS calls
    dst->push_back(w);
  }
}